

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

bool cmVariableWatchCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  cmVariableWatchCallbackData *this;
  cmMakefile *pcVar5;
  cmake *this_00;
  cmVariableWatch *this_01;
  cmMakefile *makefile;
  string local_e0;
  FinalAction local_c0;
  cmVariableWatchCallbackData *local_b0;
  cmVariableWatchCallbackData *data;
  string local_a0;
  string local_80 [8];
  string command;
  string *variable;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"must be called with at least one argument.",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    command.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,0);
    std::__cxx11::string::string(local_80);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (1 < sVar3) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      std::__cxx11::string::operator=(local_80,(string *)pvVar4);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            command.field_2._8_8_,"CMAKE_CURRENT_LIST_FILE");
    pcVar1 = local_20;
    if (bVar2) {
      cmStrCat<char_const(&)[32],std::__cxx11::string_const&>
                (&local_a0,(char (*) [32])"cannot be set on the variable: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 command.field_2._8_8_);
      cmExecutionStatus::SetError(pcVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      args_local._7_1_ = 0;
    }
    else {
      this = (cmVariableWatchCallbackData *)operator_new(0x28);
      anon_unknown.dwarf_7314c5::cmVariableWatchCallbackData::cmVariableWatchCallbackData(this);
      this->InCallback = false;
      local_b0 = this;
      std::__cxx11::string::operator=((string *)&this->Command,local_80);
      pcVar5 = cmExecutionStatus::GetMakefile(local_20);
      this_00 = cmMakefile::GetCMakeInstance(pcVar5);
      this_01 = cmake::GetVariableWatch(this_00);
      bVar2 = cmVariableWatch::AddWatch
                        (this_01,(string *)command.field_2._8_8_,
                         anon_unknown.dwarf_7314c5::cmVariableWatchCommandVariableAccessed,local_b0,
                         anon_unknown.dwarf_7314c5::deleteVariableWatchCallbackData);
      if (bVar2) {
        pcVar5 = cmExecutionStatus::GetMakefile(local_20);
        makefile = cmExecutionStatus::GetMakefile(local_20);
        std::__cxx11::string::string((string *)&local_e0,(string *)command.field_2._8_8_);
        anon_unknown.dwarf_7314c5::FinalAction::FinalAction(&local_c0,makefile,&local_e0);
        cmMakefile::AddGeneratorAction<(anonymous_namespace)::FinalAction>(pcVar5,&local_c0);
        anon_unknown.dwarf_7314c5::FinalAction::~FinalAction(&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        args_local._7_1_ = 1;
      }
      else {
        anon_unknown.dwarf_7314c5::deleteVariableWatchCallbackData(local_b0);
        args_local._7_1_ = 0;
      }
    }
    data._4_4_ = 1;
    std::__cxx11::string::~string(local_80);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmVariableWatchCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    status.SetError(cmStrCat("cannot be set on the variable: ", variable));
    return false;
  }

  auto* const data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = std::move(command);

  if (!status.GetMakefile().GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  status.GetMakefile().AddGeneratorAction(
    FinalAction{ &status.GetMakefile(), variable });
  return true;
}